

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_os_homedir(char *buffer,size_t *size)

{
  int iVar1;
  __uid_t uid;
  size_t sVar2;
  size_t sVar3;
  uv_passwd_t pwd;
  uv_passwd_t local_50;
  
  iVar1 = uv_os_getenv("HOME",buffer,size);
  if (iVar1 == -2) {
    uid = geteuid();
    iVar1 = uv__getpwuid_r(&local_50,uid);
    if (iVar1 == 0) {
      sVar2 = strlen(local_50.homedir);
      iVar1 = -0x69;
      sVar3 = sVar2 + 1;
      if (sVar2 < *size) {
        memcpy(buffer,local_50.homedir,sVar2 + 1);
        iVar1 = 0;
        sVar3 = sVar2;
      }
      *size = sVar3;
      uv_os_free_passwd(&local_50);
    }
  }
  return iVar1;
}

Assistant:

int uv_os_homedir(char* buffer, size_t* size) {
  uv_passwd_t pwd;
  size_t len;
  int r;

  /* Check if the HOME environment variable is set first. The task of
     performing input validation on buffer and size is taken care of by
     uv_os_getenv(). */
  r = uv_os_getenv("HOME", buffer, size);

  if (r != UV_ENOENT)
    return r;

  /* HOME is not set, so call uv_os_get_passwd() */
  r = uv_os_get_passwd(&pwd);

  if (r != 0) {
    return r;
  }

  len = strlen(pwd.homedir);

  if (len >= *size) {
    *size = len + 1;
    uv_os_free_passwd(&pwd);
    return UV_ENOBUFS;
  }

  memcpy(buffer, pwd.homedir, len + 1);
  *size = len;
  uv_os_free_passwd(&pwd);

  return 0;
}